

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall CompilerContext::compile_repeat(CompilerContext *this,SyntaxTree *repeat_node)

{
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_01;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_02;
  RepeatAnnotation *pRVar1;
  SyntaxTree *arg_node;
  SyntaxTree *arg_node_00;
  SyntaxTree *base;
  Command *pCVar2;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_3e8;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_3b8;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_390;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_350;
  shared_ptr<Label> local_320;
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_309;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  local_308;
  undefined1 local_2d0 [47];
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_2a1;
  ArgVariant *local_2a0;
  ArgVariant local_298;
  ArgVariant local_260;
  undefined1 local_228 [47];
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_1f9;
  ArgVariant *local_1f8;
  ArgVariant local_1f0;
  ArgVariant local_1b8;
  undefined1 local_180 [40];
  shared_ptr<Label> local_158;
  shared_ptr<Label> local_148;
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_131;
  ArgVariant *local_130;
  ArgVariant local_128;
  ArgVariant local_f0;
  undefined1 local_b8 [40];
  LoopInfo local_90;
  undefined1 local_70 [8];
  shared_ptr<Label> loop_ptr;
  undefined1 local_50 [8];
  shared_ptr<Label> break_ptr;
  shared_ptr<Label> continue_ptr;
  SyntaxTree *var;
  SyntaxTree *times;
  RepeatAnnotation *annotation;
  SyntaxTree *repeat_node_local;
  CompilerContext *this_local;
  
  pRVar1 = SyntaxTree::annotation<RepeatAnnotation_const&>(repeat_node);
  arg_node = SyntaxTree::child(repeat_node,0);
  arg_node_00 = SyntaxTree::child(repeat_node,1);
  make_internal_label((CompilerContext *)
                      &break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  make_internal_label((CompilerContext *)local_50);
  make_internal_label((CompilerContext *)local_70);
  std::shared_ptr<Label>::shared_ptr
            (&local_90.continue_label,
             (shared_ptr<Label> *)
             &break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Label>::shared_ptr(&local_90.break_label,(shared_ptr<Label> *)local_50);
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>(&this->loop_stack,&local_90);
  LoopInfo::~LoopInfo(&local_90);
  pCVar2 = pRVar1->set_var_to_zero;
  local_130 = &local_128;
  get_arg(local_130,this,arg_node_00);
  local_130 = &local_f0;
  get_arg(local_130,this,&pRVar1->number_zero);
  local_b8._0_8_ = &local_128;
  local_b8._8_8_ = 2;
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::allocator(&local_131);
  __l_02._M_len = local_b8._8_8_;
  __l_02._M_array = (iterator)local_b8._0_8_;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
            *)(local_b8 + 0x10),__l_02,&local_131);
  compile_command(this,pCVar2,(ArgList *)(local_b8 + 0x10),false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             *)(local_b8 + 0x10));
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::~allocator(&local_131);
  local_350 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
               *)local_b8;
  do {
    local_350 = local_350 + -1;
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(local_350);
  } while (local_350 != &local_128);
  std::shared_ptr<Label>::shared_ptr(&local_148,(shared_ptr<Label> *)local_70);
  compile_label(this,&local_148);
  std::shared_ptr<Label>::~shared_ptr(&local_148);
  base = SyntaxTree::child(repeat_node,2);
  compile_statements(this,base);
  std::shared_ptr<Label>::shared_ptr
            (&local_158,
             (shared_ptr<Label> *)
             &break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  compile_label(this,&local_158);
  std::shared_ptr<Label>::~shared_ptr(&local_158);
  pCVar2 = pRVar1->add_var_with_one;
  local_1f8 = &local_1f0;
  get_arg(local_1f8,this,arg_node_00);
  local_1f8 = &local_1b8;
  get_arg(local_1f8,this,&pRVar1->number_one);
  local_180._0_8_ = &local_1f0;
  local_180._8_8_ = 2;
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::allocator(&local_1f9);
  __l_01._M_len = local_180._8_8_;
  __l_01._M_array = (iterator)local_180._0_8_;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
            *)(local_180 + 0x10),__l_01,&local_1f9);
  compile_command(this,pCVar2,(ArgList *)(local_180 + 0x10),false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             *)(local_180 + 0x10));
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::~allocator(&local_1f9);
  local_390 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
               *)local_180;
  do {
    local_390 = local_390 + -1;
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(local_390);
  } while (local_390 != &local_1f0);
  pCVar2 = pRVar1->is_var_geq_times;
  local_2a0 = &local_298;
  get_arg(local_2a0,this,arg_node_00);
  local_2a0 = &local_260;
  get_arg(local_2a0,this,arg_node);
  local_228._0_8_ = &local_298;
  local_228._8_8_ = 2;
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::allocator(&local_2a1);
  __l_00._M_len = local_228._8_8_;
  __l_00._M_array = (iterator)local_228._0_8_;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
            *)(local_228 + 0x10),__l_00,&local_2a1);
  compile_command(this,pCVar2,(ArgList *)(local_228 + 0x10),false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             *)(local_228 + 0x10));
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::~allocator(&local_2a1);
  local_3b8 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
               *)local_228;
  do {
    local_3b8 = local_3b8 + -1;
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(local_3b8);
  } while (local_3b8 != &local_298);
  pCVar2 = std::experimental::optional<const_Command_&>::operator*(&this->commands->goto_if_false);
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<std::shared_ptr<Label>&,5ul,std::shared_ptr<Label>>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)&local_308,(shared_ptr<Label> *)local_70);
  local_2d0._8_8_ = 1;
  local_2d0._0_8_ =
       (variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
        *)&local_308;
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::allocator(&local_309);
  __l._M_len = local_2d0._8_8_;
  __l._M_array = (iterator)local_2d0._0_8_;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
            *)(local_2d0 + 0x10),__l,&local_309);
  compile_command(this,pCVar2,(ArgList *)(local_2d0 + 0x10),false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             *)(local_2d0 + 0x10));
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::~allocator(&local_309);
  local_3e8 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
               *)local_2d0;
  do {
    local_3e8 = local_3e8 + -1;
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(local_3e8);
  } while (local_3e8 != &local_308);
  std::shared_ptr<Label>::shared_ptr(&local_320,(shared_ptr<Label> *)local_50);
  compile_label(this,&local_320);
  std::shared_ptr<Label>::~shared_ptr(&local_320);
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::pop_back
            (&this->loop_stack);
  std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)local_70);
  std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)local_50);
  std::shared_ptr<Label>::~shared_ptr
            ((shared_ptr<Label> *)
             &break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void CompilerContext::compile_repeat(const SyntaxTree& repeat_node)
{
    auto& annotation = repeat_node.annotation<const RepeatAnnotation&>();
    auto& times = repeat_node.child(0);
    auto& var = repeat_node.child(1);

    auto continue_ptr = make_internal_label();
    auto break_ptr    = make_internal_label();
    auto loop_ptr     = make_internal_label();

    loop_stack.emplace_back(LoopInfo { continue_ptr, break_ptr });

    compile_command(annotation.set_var_to_zero, { get_arg(var), get_arg(annotation.number_zero) });
    compile_label(loop_ptr);
    compile_statements(repeat_node.child(2));
    compile_label(continue_ptr);
    compile_command(annotation.add_var_with_one, { get_arg(var), get_arg(annotation.number_one) });
    compile_command(annotation.is_var_geq_times, { get_arg(var), get_arg(times) });
    compile_command(*this->commands.goto_if_false, { loop_ptr });
    compile_label(break_ptr);

    loop_stack.pop_back();
}